

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::erase
          (QGenericArrayOps<QDockAreaLayoutItem> *this,QDockAreaLayoutItem *b,qsizetype n)

{
  QDockAreaLayoutItem *pQVar1;
  QDockAreaLayoutItem *pQVar2;
  long lVar3;
  QDockAreaLayoutItem *pQVar4;
  QDockAreaLayoutItem *end;
  
  pQVar4 = b + n;
  pQVar2 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr;
  lVar3 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
  pQVar1 = pQVar2 + lVar3;
  if (pQVar4 == pQVar1 || pQVar2 != b) {
    if (pQVar4 != pQVar1) {
      do {
        QDockAreaLayoutItem::operator=(b,b + n);
        pQVar4 = b + n + 1;
        b = b + 1;
      } while (pQVar4 != pQVar1);
      lVar3 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
      pQVar4 = pQVar1;
    }
  }
  else {
    (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr = pQVar4;
  }
  (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size = lVar3 - n;
  for (; b != pQVar4; b = b + 1) {
    QDockAreaLayoutItem::~QDockAreaLayoutItem(b);
  }
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }